

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp analyze_seq(sexp ctx,sexp ls,int depth,int defok)

{
  sexp psVar1;
  sexp local_50;
  sexp_conflict local_48;
  sexp_gc_var_t local_40;
  sexp_gc_var_t local_30;
  
  local_40.var = &local_50;
  local_50 = (sexp)0x43e;
  local_30.var = &local_48;
  local_48 = (sexp_conflict)0x43e;
  local_30.next = &local_40;
  local_40.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_30;
  psVar1 = (sexp)&DAT_0000043e;
  if (ls != (sexp)&DAT_0000023e) {
    if ((ls->value).type.cpl == (sexp)0x23e) {
      psVar1 = analyze(ctx,(ls->value).type.name,depth,defok);
    }
    else {
      local_50 = sexp_alloc_tagged_aux(ctx,0x18,0x21);
      (local_50->value).type.cpl = (ls->value).type.slots;
      psVar1 = analyze_list(ctx,ls,depth,defok);
      if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
        (local_50->value).type.name = psVar1;
        psVar1 = local_50;
      }
    }
  }
  (ctx->value).context.saves = local_40.next;
  return psVar1;
}

Assistant:

static sexp analyze_seq (sexp ctx, sexp ls, int depth, int defok) {
  sexp_gc_var2(res, tmp);
  sexp_gc_preserve2(ctx, res, tmp);
  if (sexp_nullp(ls))
    res = SEXP_VOID;
  else if (sexp_nullp(sexp_cdr(ls)))
    res = analyze(ctx, sexp_car(ls), depth, defok);
  else {
    res = sexp_alloc_type(ctx, seq, SEXP_SEQ);
    sexp_seq_source(res) = sexp_pair_source(ls);
    tmp = analyze_list(ctx, ls, depth, defok);
    if (sexp_exceptionp(tmp))
      res = tmp;
    else
      sexp_seq_ls(res) = tmp;
  }
  sexp_gc_release2(ctx);
  return res;
}